

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O0

bool utf8::CharsAreEqual(LPCOLESTR pch,LPCUTF8 bch,LPCUTF8 end,DecodeOptions options)

{
  char16 cVar1;
  char16 cVar2;
  DecodeOptions local_30;
  DecodeOptions local_2c;
  DecodeOptions localOptions;
  DecodeOptions options_local;
  LPCUTF8 end_local;
  LPCUTF8 bch_local;
  LPCOLESTR pch_local;
  
  local_30 = options;
  local_2c = options;
  _localOptions = end;
  end_local = bch;
  bch_local = (LPCUTF8)pch;
  do {
    if (_localOptions <= end_local) {
      return true;
    }
    cVar1 = *(char16 *)bch_local;
    bch_local = bch_local + 2;
    cVar2 = Decode(&end_local,_localOptions,&local_30,(bool *)0x0);
  } while (cVar1 == cVar2);
  return false;
}

Assistant:

bool CharsAreEqual(LPCOLESTR pch, LPCUTF8 bch, LPCUTF8 end, DecodeOptions options)
    {
        DecodeOptions localOptions = options;
        while (bch < end)
        {
            if (*pch++ != utf8::Decode(bch, end, localOptions))
            {
                return false;
            }
        }
        return true;
    }